

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O2

void __thiscall kpeg::JPEGEncoder::levelShiftComponents(JPEGEncoder *this)

{
  Level LVar1;
  uint uVar2;
  Logger *pLVar3;
  ostream *poVar4;
  Level lvl;
  Level lvl_00;
  long lVar5;
  element_type *peVar6;
  long lVar7;
  int x;
  ulong uVar8;
  _Alloc_hider local_58;
  element_type *local_38;
  
  pLVar3 = Logger::get();
  LVar1 = Logger::getLevel(pLVar3);
  if (0 < (int)LVar1) {
    pLVar3 = Logger::get();
    poVar4 = Logger::getStream(pLVar3);
    Logger::levelStr_abi_cxx11_((string *)&stack0xffffffffffffffa8,(Logger *)0x1,lvl);
    poVar4 = std::operator<<(poVar4,(string *)&stack0xffffffffffffffa8);
    poVar4 = std::operator<<(poVar4,"[ kpeg:");
    poVar4 = std::operator<<(poVar4,"Encoder.cpp");
    poVar4 = std::operator<<(poVar4,":");
    *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x199);
    poVar4 = std::operator<<(poVar4," ] ");
    poVar4 = std::operator<<(poVar4,"Performing level shift on components...");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  }
  peVar6 = (element_type *)0x0;
  while( true ) {
    uVar2 = Image::getHeight(&this->m_image);
    if ((element_type *)(ulong)uVar2 <= peVar6) break;
    lVar5 = (long)peVar6 * 0x18;
    lVar7 = 0;
    uVar8 = 0;
    local_38 = peVar6;
    while( true ) {
      uVar2 = Image::getWidth(&this->m_image);
      if (uVar2 <= uVar8) break;
      Image::getFlPixelPtr((Image *)&stack0xffffffffffffffa8);
      *(float *)(*(long *)(*(long *)local_58._M_p + lVar5) + lVar7) =
           *(float *)(*(long *)(*(long *)local_58._M_p + lVar5) + lVar7) + -128.0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb0);
      Image::getFlPixelPtr((Image *)&stack0xffffffffffffffa8);
      *(float *)(*(long *)(*(long *)local_58._M_p + lVar5) + 4 + lVar7) =
           *(float *)(*(long *)(*(long *)local_58._M_p + lVar5) + 4 + lVar7) + -128.0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb0);
      Image::getFlPixelPtr((Image *)&stack0xffffffffffffffa8);
      *(float *)(*(long *)(*(long *)local_58._M_p + lVar5) + 8 + lVar7) =
           *(float *)(*(long *)(*(long *)local_58._M_p + lVar5) + 8 + lVar7) + -128.0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb0);
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0xc;
    }
    peVar6 = (element_type *)
             ((long)&(local_38->
                     super__Vector_base<std::vector<kpeg::Pixel,_std::allocator<kpeg::Pixel>_>,_std::allocator<std::vector<kpeg::Pixel,_std::allocator<kpeg::Pixel>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  pLVar3 = Logger::get();
  LVar1 = Logger::getLevel(pLVar3);
  if (0 < (int)LVar1) {
    pLVar3 = Logger::get();
    poVar4 = Logger::getStream(pLVar3);
    Logger::levelStr_abi_cxx11_((string *)&stack0xffffffffffffffa8,(Logger *)0x1,lvl_00);
    poVar4 = std::operator<<(poVar4,(string *)&stack0xffffffffffffffa8);
    poVar4 = std::operator<<(poVar4,"[ kpeg:");
    poVar4 = std::operator<<(poVar4,"Encoder.cpp");
    poVar4 = std::operator<<(poVar4,":");
    *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1a5);
    poVar4 = std::operator<<(poVar4," ] ");
    poVar4 = std::operator<<(poVar4,"Level shift complete [OK]");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  }
  return;
}

Assistant:

void JPEGEncoder::levelShiftComponents()
    {
        LOG(Logger::Level::INFO) << "Performing level shift on components..." << std::endl;
        
        for ( int y = 0; y < m_image.getHeight(); ++y )
        {
            for ( int x = 0; x < m_image.getWidth(); ++x )
            {
                (*m_image.getFlPixelPtr())[y][x].comp[YCbCrComponents::Y] -= 128;
                (*m_image.getFlPixelPtr())[y][x].comp[YCbCrComponents::Cb] -= 128;
                (*m_image.getFlPixelPtr())[y][x].comp[YCbCrComponents::Cr] -= 128;
            }
        }
        
        LOG(Logger::Level::INFO) << "Level shift complete [OK]" << std::endl;
        
//         for ( auto&& row : *m_image.getFlPixelPtr() )
//         {
//             for ( auto&& val : row )
//             {
//                 std::cout << val.comp[0] << "," << val.comp[1] << "," << val.comp[2] << "\t";
//             }
//             std::cout << std::endl;
//         }
//         std::cout << std::endl;
    }